

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGRSubgraphMining.cpp
# Opt level: O2

size_t dgrminer::support<std::set<int,std::less<int>,std::allocator<int>>>
                 (set<int,_std::less<int>,_std::allocator<int>_> *occurrences,
                 unordered_map<int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
                 *multiple_occurrences,bool new_measures,bool heuristic_mis)

{
  _Rb_tree_node_base *__k;
  int iVar1;
  mapped_type *pmVar2;
  mapped_type *pmVar3;
  _Base_ptr p_Var4;
  _Rb_tree_const_iterator<std::set<int,_std::less<int>,_std::allocator<int>_>_> _Var5;
  _Rb_tree_const_iterator<std::set<int,_std::less<int>,_std::allocator<int>_>_> __x;
  _Rb_tree_node_base *p_Var6;
  undefined7 in_register_00000011;
  size_t local_110;
  map<std::set<int,_std::less<int>,_std::allocator<int>_>,_int,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::set<int,_std::less<int>,_std::allocator<int>_>,_int>_>_>
  mapping;
  set<int,_std::less<int>,_std::allocator<int>_> intersect;
  OverlapGraph og;
  
  if ((int)CONCAT71(in_register_00000011,new_measures) == 0) {
    local_110 = (occurrences->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  }
  else {
    p_Var6 = (occurrences->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_110 = 0;
    for (; (_Rb_tree_header *)p_Var6 != &(occurrences->_M_t)._M_impl.super__Rb_tree_header;
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
      __k = p_Var6 + 1;
      OverlapGraph::OverlapGraph(&og,heuristic_mis);
      mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &mapping._M_t._M_impl.super__Rb_tree_header._M_header;
      mapping._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      pmVar2 = std::__detail::
               _Map_base<int,_std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at((_Map_base<int,_std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)multiple_occurrences,(key_type *)__k);
      for (p_Var4 = (pmVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var4 != &(pmVar2->_M_t)._M_impl.super__Rb_tree_header;
          p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
        iVar1 = OverlapGraph::addVertex(&og);
        pmVar3 = std::
                 map<std::set<int,_std::less<int>,_std::allocator<int>_>,_int,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::set<int,_std::less<int>,_std::allocator<int>_>,_int>_>_>
                 ::operator[](&mapping,(key_type *)(p_Var4 + 1));
        *pmVar3 = iVar1;
      }
      pmVar2 = std::__detail::
               _Map_base<int,_std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at((_Map_base<int,_std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)multiple_occurrences,(key_type *)__k);
      for (__x._M_node = (pmVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          pmVar2 = std::__detail::
                   _Map_base<int,_std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::at((_Map_base<int,_std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)multiple_occurrences,(key_type *)__k),
          (_Rb_tree_header *)__x._M_node != &(pmVar2->_M_t)._M_impl.super__Rb_tree_header;
          __x._M_node = (_Base_ptr)std::_Rb_tree_increment(__x._M_node)) {
        _Var5 = std::
                next<std::_Rb_tree_const_iterator<std::set<int,std::less<int>,std::allocator<int>>>>
                          (__x,1);
        for (; pmVar2 = std::__detail::
                        _Map_base<int,_std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::at((_Map_base<int,_std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)multiple_occurrences,(key_type *)__k),
            (_Rb_tree_header *)_Var5._M_node != &(pmVar2->_M_t)._M_impl.super__Rb_tree_header;
            _Var5._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var5._M_node)) {
          intersect._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          intersect._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          intersect._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &intersect._M_t._M_impl.super__Rb_tree_header._M_header;
          intersect._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          intersect._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               intersect._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          std::
          __set_intersection<std::_Rb_tree_const_iterator<int>,std::_Rb_tree_const_iterator<int>,std::insert_iterator<std::set<int,std::less<int>,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (__x._M_node[1]._M_right,&__x._M_node[1]._M_parent,_Var5._M_node[1]._M_right,
                     &_Var5._M_node[1]._M_parent,&intersect);
          if (intersect._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
            pmVar3 = std::
                     map<std::set<int,_std::less<int>,_std::allocator<int>_>,_int,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::set<int,_std::less<int>,_std::allocator<int>_>,_int>_>_>
                     ::at(&mapping,(key_type *)(__x._M_node + 1));
            iVar1 = *pmVar3;
            pmVar3 = std::
                     map<std::set<int,_std::less<int>,_std::allocator<int>_>,_int,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::set<int,_std::less<int>,_std::allocator<int>_>,_int>_>_>
                     ::at(&mapping,(key_type *)(_Var5._M_node + 1));
            OverlapGraph::addEdge(&og,iVar1,*pmVar3);
          }
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          ~_Rb_tree(&intersect._M_t);
        }
      }
      iVar1 = OverlapGraph::computeSupport(&og);
      local_110 = local_110 + (long)iVar1;
      std::
      _Rb_tree<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::pair<const_std::set<int,_std::less<int>,_std::allocator<int>_>,_int>,_std::_Select1st<std::pair<const_std::set<int,_std::less<int>,_std::allocator<int>_>,_int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::set<int,_std::less<int>,_std::allocator<int>_>,_int>_>_>
      ::~_Rb_tree(&mapping._M_t);
      OverlapGraph::~OverlapGraph(&og);
    }
  }
  return local_110;
}

Assistant:

inline size_t support(const T &occurrences,
					  const std::unordered_map<int, std::set<std::set<int>>> &multiple_occurrences,
					  bool new_measures,
					  bool heuristic_mis
	) {
	  	if (new_measures) {
		  	size_t support = 0;

			for (auto const &snapshotId : occurrences) {
		  		OverlapGraph og(heuristic_mis);
		  		std::map<std::set<int>, int> mapping;

		  		for (auto const &occurrence : multiple_occurrences.at(snapshotId)) {
					mapping[occurrence] = og.addVertex();
		  		}

			  	for (
			  		auto firstOccurrence = multiple_occurrences.at(snapshotId).begin();
			  		firstOccurrence != multiple_occurrences.at(snapshotId).end();
			  		++firstOccurrence
				) {
					for (
						auto secondOccurrence = std::next(firstOccurrence);
						secondOccurrence != multiple_occurrences.at(snapshotId).end();
						++secondOccurrence
					) {
						std::set<int> intersect;
						std::set_intersection(
							firstOccurrence->begin(), firstOccurrence->end(),
							secondOccurrence->begin(), secondOccurrence->end(),
							std::inserter(intersect,intersect.begin())
						);

						if (!intersect.empty()) {
						  	og.addEdge(mapping.at(*firstOccurrence), mapping.at(*secondOccurrence));
						}
					}
				}

			  	support += og.computeSupport();
			}

		  	return support;
		}

	  	return occurrences.size();
	}